

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_paramSwitch_e useRowMatchFinder,void *src,size_t srcSize)

{
  ZSTD_blockCompressor p_Var1;
  ZSTD_matchState_t *op_00;
  BYTE *iend_00;
  BYTE *ip_00;
  long lVar2;
  ulong uVar3;
  U32 *in_RCX;
  seqStore_t *in_RDX;
  BYTE *dst;
  ZSTD_matchState_t *in_RSI;
  rawSeqStore_t *in_RDI;
  undefined4 in_R8D;
  ZSTD_matchState_t *in_R9;
  rawSeq rVar4;
  size_t in_stack_00000008;
  size_t newLitLength;
  int i;
  rawSeq sequence;
  size_t lastLLSize;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  ZSTD_blockCompressor blockCompressor;
  uint minMatch;
  ZSTD_compressionParameters *cParams;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  undefined8 in_stack_fffffffffffffea8;
  ZSTD_dictMode_e dictMode;
  undefined8 in_stack_fffffffffffffeb0;
  BYTE *in_stack_fffffffffffffeb8;
  ZSTD_matchState_t *in_stack_fffffffffffffec0;
  int local_11c;
  uint local_110;
  U32 local_104;
  uint uStack_100;
  ZSTD_matchState_t *local_f0;
  size_t local_90;
  BYTE *local_38;
  BYTE *local_30;
  
  dictMode = (ZSTD_dictMode_e)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  ZSTD_matchState_dictMode((ZSTD_matchState_t *)CONCAT44(in_R8D,(in_RSI->cParams).strategy));
  p_Var1 = ZSTD_selectBlockCompressor
                     ((ZSTD_strategy)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                      (ZSTD_paramSwitch_e)in_stack_fffffffffffffeb0,dictMode);
  op_00 = (ZSTD_matchState_t *)((long)in_R9->hashCache + (in_stack_00000008 - 0x40));
  if ((in_RSI->cParams).strategy < ZSTD_btopt) {
    if (in_RDI->size < in_RDI->pos) {
      __assert_fail("rawSeqStore->pos <= rawSeqStore->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7efb,
                    "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                   );
    }
    local_f0 = in_R9;
    if (in_RDI->capacity < in_RDI->size) {
      __assert_fail("rawSeqStore->size <= rawSeqStore->capacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7efc,
                    "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                   );
    }
    for (; in_RDI->pos < in_RDI->size && local_f0 < op_00;
        local_f0 = (ZSTD_matchState_t *)
                   ((long)local_f0->hashCache + (ulong)local_110 + (ulong)uStack_100 + -0x40)) {
      rVar4 = maybeSplitSequence((rawSeqStore_t *)in_stack_fffffffffffffec0,
                                 (U32)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                                 (U32)in_stack_fffffffffffffeb8);
      local_110 = rVar4.matchLength;
      local_104 = rVar4.offset;
      if (local_104 == 0) break;
      uStack_100 = rVar4.litLength;
      if (op_00 < (ZSTD_matchState_t *)
                  ((long)local_f0->hashCache + (ulong)local_110 + (ulong)uStack_100 + -0x40)) {
        __assert_fail("ip + sequence.litLength + sequence.matchLength <= iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7f07,
                      "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                     );
      }
      ZSTD_ldm_limitTableUpdate(in_RSI,(BYTE *)local_f0);
      ZSTD_ldm_fillFastTables(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      iend_00 = (BYTE *)(*p_Var1)(in_RSI,in_RDX,in_RCX,local_f0,rVar4._4_8_);
      for (local_11c = 2; 0 < local_11c; local_11c = local_11c + -1) {
        in_RCX[local_11c] = in_RCX[local_11c + -1];
      }
      *in_RCX = local_104;
      ip_00 = (BYTE *)((long)local_f0 + ((ulong)uStack_100 - (long)iend_00));
      if (local_104 == 0) {
        __assert_fail("(sequence.offset)>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7f18,
                      "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                     );
      }
      if (in_RDX->maxNbSeq <= (ulong)((long)in_RDX->sequences - (long)in_RDX->sequencesStart >> 3))
      {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < in_RDX->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (in_RDX->litStart + in_RDX->maxNbLit < iend_00 + (long)in_RDX->lit) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468e,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (op_00 < (ZSTD_matchState_t *)(ip_00 + (long)iend_00)) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      in_stack_fffffffffffffec0 = op_00;
      if (&op_00[-1].cParams.minMatch < ip_00 + (long)iend_00) {
        ZSTD_safecopyLiterals((BYTE *)op_00,ip_00,iend_00,(BYTE *)in_RDX);
        in_stack_fffffffffffffeb8 = ip_00;
      }
      else {
        in_stack_fffffffffffffeb8 = ip_00;
        ZSTD_copy16(in_RDX->lit,ip_00);
        if ((BYTE *)0x10 < iend_00) {
          local_38 = in_RDX->lit;
          dst = local_38 + 0x10;
          lVar2 = (long)dst - (long)(ip_00 + 0x10);
          if ((lVar2 < 0x10) && (-0x10 < lVar2)) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(dst,ip_00 + 0x10);
          if (0x10 < (long)(iend_00 + -0x10)) {
            local_38 = local_38 + 0x20;
            do {
              local_30 = ip_00 + 0x20;
              ZSTD_copy16(local_38,local_30);
              ZSTD_copy16(local_38 + 0x10,ip_00 + 0x30);
              local_38 = local_38 + 0x20;
              ip_00 = local_30;
            } while (local_38 < dst + (long)(iend_00 + -0x10));
          }
        }
      }
      in_RDX->lit = iend_00 + (long)in_RDX->lit;
      if ((BYTE *)0xffff < iend_00) {
        if (in_RDX->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        in_RDX->longLengthType = ZSTD_llt_literalLength;
        in_RDX->longLengthPos = (U32)((long)in_RDX->sequences - (long)in_RDX->sequencesStart >> 3);
      }
      in_RDX->sequences->litLength = (U16)iend_00;
      in_RDX->sequences->offBase = local_104 + 3;
      if ((ulong)local_110 < 3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46aa,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar3 = (ulong)local_110 - 3;
      if (0xffff < uVar3) {
        if (in_RDX->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46ad,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        in_RDX->longLengthType = ZSTD_llt_matchLength;
        in_RDX->longLengthPos = (U32)((long)in_RDX->sequences - (long)in_RDX->sequencesStart >> 3);
      }
      in_RDX->sequences->mlBase = (U16)uVar3;
      in_RDX->sequences = in_RDX->sequences + 1;
    }
    ZSTD_ldm_limitTableUpdate(in_RSI,(BYTE *)local_f0);
    ZSTD_ldm_fillFastTables(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    local_90 = (*p_Var1)(in_RSI,in_RDX,in_RCX,local_f0,(long)op_00 - (long)local_f0);
  }
  else {
    in_RSI->ldmSeqStore = in_RDI;
    local_90 = (*p_Var1)(in_RSI,in_RDX,in_RCX,in_R9,in_stack_00000008);
    ZSTD_ldm_skipRawSeqStoreBytes(in_RDI,in_stack_00000008);
  }
  return local_90;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_paramSwitch_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          OFFSET_TO_OFFBASE(sequence.offset),
                          sequence.matchLength);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}